

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetInputMode(GLFWwindow *handle,int mode)

{
  _GLFWwindow *window;
  int mode_local;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/input.c",
                  0x1f0,"int glfwGetInputMode(GLFWwindow *, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local._4_4_ = 0;
  }
  else {
    switch(mode) {
    case 0x33001:
      handle_local._4_4_ = *(int *)(handle + 0x84);
      break;
    case 0x33002:
      handle_local._4_4_ = *(int *)(handle + 0x78);
      break;
    case 0x33003:
      handle_local._4_4_ = *(int *)(handle + 0x7c);
      break;
    case 0x33004:
      handle_local._4_4_ = *(int *)(handle + 0x80);
      break;
    case 0x33005:
      handle_local._4_4_ = *(int *)(handle + 0x200);
      break;
    default:
      _glfwInputError(0x10003,"Invalid input mode 0x%08X",(ulong)(uint)mode);
      handle_local._4_4_ = 0;
    }
  }
  return handle_local._4_4_;
}

Assistant:

GLFWAPI int glfwGetInputMode(GLFWwindow* handle, int mode)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(0);

    switch (mode)
    {
        case GLFW_CURSOR:
            return window->cursorMode;
        case GLFW_STICKY_KEYS:
            return window->stickyKeys;
        case GLFW_STICKY_MOUSE_BUTTONS:
            return window->stickyMouseButtons;
        case GLFW_LOCK_KEY_MODS:
            return window->lockKeyMods;
        case GLFW_RAW_MOUSE_MOTION:
            return window->rawMouseMotion;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
    return 0;
}